

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceStringsWrapper.cpp
# Opt level: O0

bool __thiscall ResourceStringsWrapper::wrap(ResourceStringsWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ResString *this_00;
  ResString *local_80 [3];
  ResString *local_68;
  ResString *rStr;
  Executable *exe;
  WORD *uStringPtr;
  bufsize_t totalStrSize;
  size_t wStrSize;
  WORD *stringSize;
  offset_t cRaw;
  offset_t startRaw;
  size_t maxSize;
  BYTE *c;
  ResourceStringsWrapper *this_local;
  
  c = (BYTE *)this;
  (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
    super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  this->parsedSize = 0;
  iVar1 = (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  maxSize = CONCAT44(extraout_var,iVar1);
  if (maxSize == 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*(this->super_ResourceContentWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xd])();
    startRaw = CONCAT44(extraout_var_00,iVar1);
    stringSize = (WORD *)ResourceContentWrapper::getContentRaw(&this->super_ResourceContentWrapper);
    cRaw = (offset_t)stringSize;
    while (this->parsedSize < startRaw) {
      wStrSize = (size_t)ResourceContentWrapper::getContentAt
                                   (&this->super_ResourceContentWrapper,(offset_t)stringSize,RAW,2);
      if ((ushort *)wStrSize == (ushort *)0x0) {
        printf("Cannot fetch the string size!\n");
        break;
      }
      this->parsedSize = this->parsedSize + 2;
      stringSize = stringSize + 1;
      totalStrSize = (bufsize_t)*(ushort *)wStrSize;
      if (totalStrSize != 0) {
        uStringPtr = (WORD *)(totalStrSize << 1);
        exe = (Executable *)
              ResourceContentWrapper::getContentAt
                        (&this->super_ResourceContentWrapper,(offset_t)stringSize,RAW,
                         (bufsize_t)uStringPtr);
        if (exe == (Executable *)0x0) break;
        rStr = (ResString *)ResourceLeafWrapper::getExe((this->super_ResourceContentWrapper).myLeaf)
        ;
        this_00 = (ResString *)operator_new(0x50);
        ResString::ResString
                  (this_00,(WORD *)exe,(WORD *)wStrSize,(offset_t)stringSize,(Executable *)rStr);
        local_80[0] = this_00;
        local_68 = this_00;
        std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::push_back
                  (&(this->super_ResourceContentWrapper).super_ExeNodeWrapper.entries,
                   (value_type *)local_80);
        this->parsedSize = (long)uStringPtr + this->parsedSize;
        stringSize = (WORD *)((long)uStringPtr + (long)stringSize);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ResourceStringsWrapper::wrap()
{
    clear();
    this->parsedSize = 0;

    BYTE *c = static_cast<BYTE*>(this->getPtr());
    if (!c) {
        return false;
    }
    size_t maxSize = this->getSize();
    //printf("maxSize = %x\n", maxSize);
    offset_t startRaw = getContentRaw();
    offset_t cRaw = startRaw;

    while (parsedSize < maxSize) {

        WORD* stringSize = (WORD*) this->getContentAt(cRaw, Executable::RAW, sizeof(WORD));
        if (stringSize == NULL){
            printf("Cannot fetch the string size!\n");
            break;
        }
        this->parsedSize += sizeof(WORD);
        cRaw += sizeof(WORD);

        size_t wStrSize = (*stringSize);
        if (wStrSize == 0) {
            continue;
        }
        bufsize_t totalStrSize = wStrSize * sizeof(WORD);

        WORD* uStringPtr = (WORD*) this->getContentAt(cRaw, Executable::RAW, totalStrSize);
        if (uStringPtr == NULL) break;

        Executable *exe = this->myLeaf->getExe();
        ResString *rStr = new ResString(uStringPtr, stringSize, cRaw, exe);
        this->entries.push_back(rStr);

        this->parsedSize += totalStrSize;
        cRaw += totalStrSize;
    }
    return true;
}